

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::peer_list::erase_peer(peer_list *this,iterator *i,torrent_state *state)

{
  int iVar1;
  torrent_peer_allocator_interface *ptVar2;
  bool bVar3;
  reference pptVar4;
  difference_type dVar5;
  size_type sVar6;
  iterator local_b0;
  const_iterator local_90;
  torrent_peer **local_70;
  const_iterator local_68;
  __normal_iterator<libtorrent::aux::torrent_peer_**,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
  local_60;
  __normal_iterator<libtorrent::aux::torrent_peer_**,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
  local_58;
  __normal_iterator<libtorrent::aux::torrent_peer_**,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
  local_50;
  __normal_iterator<libtorrent::aux::torrent_peer_**,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
  local_48;
  __normal_iterator<libtorrent::aux::torrent_peer_**,_std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>_>
  ci;
  torrent_state *state_local;
  iterator *i_local;
  peer_list *this_local;
  
  pptVar4 = ::std::
            _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
            ::operator*(i);
  ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  push_back(&state->erased,pptVar4);
  pptVar4 = ::std::
            _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
            ::operator*(i);
  if ((*(uint *)&(*pptVar4)->field_0x1b >> 7 & 1) != 0) {
    *(uint *)&this->field_0x60 =
         *(uint *)&this->field_0x60 & 0x80000000 |
         (*(uint *)&this->field_0x60 & 0x7fffffff) - 1 & 0x7fffffff;
  }
  pptVar4 = ::std::
            _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
            ::operator*(i);
  bVar3 = is_connect_candidate(this,*pptVar4);
  if (bVar3) {
    update_connect_candidates(this,-1);
  }
  iVar1 = this->m_round_robin;
  ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  begin((iterator *)&ci,
        (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *)
        this);
  dVar5 = ::std::operator-(i,(_Self *)&ci);
  if (dVar5 < iVar1) {
    this->m_round_robin = this->m_round_robin + -1;
  }
  iVar1 = this->m_round_robin;
  sVar6 = ::std::
          deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
          size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                *)this);
  if ((int)sVar6 <= iVar1) {
    this->m_round_robin = 0;
  }
  local_50._M_current =
       (torrent_peer **)
       ::std::
       vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
       begin(&this->m_candidate_cache);
  local_58._M_current =
       (torrent_peer **)
       ::std::
       vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
       end(&this->m_candidate_cache);
  pptVar4 = ::std::
            _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
            ::operator*(i);
  local_48 = ::std::
             find<__gnu_cxx::__normal_iterator<libtorrent::aux::torrent_peer**,std::vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>>,libtorrent::aux::torrent_peer*>
                       (local_50,local_58,pptVar4);
  local_60._M_current =
       (torrent_peer **)
       ::std::
       vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
       end(&this->m_candidate_cache);
  bVar3 = __gnu_cxx::operator!=(&local_48,&local_60);
  if (bVar3) {
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::torrent_peer*const*,std::vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>>
    ::__normal_iterator<libtorrent::aux::torrent_peer**>
              ((__normal_iterator<libtorrent::aux::torrent_peer*const*,std::vector<libtorrent::aux::torrent_peer*,std::allocator<libtorrent::aux::torrent_peer*>>>
                *)&local_68,&local_48);
    local_70 = (torrent_peer **)
               ::std::
               vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ::erase(&this->m_candidate_cache,local_68);
  }
  ptVar2 = this->m_peer_allocator;
  pptVar4 = ::std::
            _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
            ::operator*(i);
  (*ptVar2->_vptr_torrent_peer_allocator_interface[1])(ptVar2,*pptVar4);
  ::std::
  _Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*const&,libtorrent::aux::torrent_peer*const*>
  ::
  _Deque_iterator<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,void>
            ((_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*const&,libtorrent::aux::torrent_peer*const*>
              *)&local_90,i);
  ::std::deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  erase(&local_b0,
        (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *)
        this,&local_90);
  return;
}

Assistant:

void peer_list::erase_peer(iterator i, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;
		TORRENT_ASSERT(i != m_peers.end());
		TORRENT_ASSERT(m_locked_peer != *i);

		state->erased.push_back(*i);
		if ((*i)->seed)
		{
			TORRENT_ASSERT(m_num_seeds > 0);
			--m_num_seeds;
		}
		if (is_connect_candidate(**i))
			update_connect_candidates(-1);
		TORRENT_ASSERT(m_num_connect_candidates < int(m_peers.size()));
		if (m_round_robin > i - m_peers.begin()) --m_round_robin;
		if (m_round_robin >= int(m_peers.size())) m_round_robin = 0;

		// if this peer is in the connect candidate
		// cache, erase it from there as well
		auto const ci = std::find(m_candidate_cache.begin(), m_candidate_cache.end(), *i);
		if (ci != m_candidate_cache.end()) m_candidate_cache.erase(ci);

		m_peer_allocator.free_peer_entry(*i);
		m_peers.erase(i);
	}